

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Free(Extension *this)

{
  byte bVar1;
  void **ppvVar2;
  LogMessage *pLVar3;
  string *this_00;
  ulong uVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  bVar1 = this->type;
  if (this->is_repeated == true) {
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar3 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_51,pLVar3);
      LogMessage::~LogMessage(&local_50);
    }
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      this_00 = (string *)(this->field_0).message_value;
      if ((this_00 != (string *)0x0) &&
         (ppvVar2 = (void **)(this_00->_M_dataplus)._M_p, ppvVar2 != (void **)0x0)) {
        operator_delete__(ppvVar2);
      }
      uVar4 = 0x10;
      goto LAB_001102dc;
    case 9:
      this_00 = (this->field_0).string_value;
      if (this_00 != (string *)0x0) {
        RepeatedPtrFieldBase::
        Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  ((RepeatedPtrFieldBase *)this_00);
      }
      break;
    case 10:
      this_00 = (this->field_0).string_value;
      if (this_00 != (string *)0x0) {
        RepeatedPtrFieldBase::
        Destroy<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                  ((RepeatedPtrFieldBase *)this_00);
      }
      break;
    default:
      goto switchD_001101fd_default;
    }
    uVar4 = 0x18;
  }
  else {
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar3 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_51,pLVar3);
      LogMessage::~LogMessage(&local_50);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
      if ((this->field_0).repeated_int32_value == (RepeatedField<int> *)0x0) {
        return;
      }
      (**(code **)(((this->field_0).repeated_int32_value)->elements_ + 2))();
      return;
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
      return;
    }
    this_00 = (string *)(this->field_0).repeated_string_value;
    if (this_00 != (string *)0x0) {
      ppvVar2 = (void **)(this_00->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppvVar2 != &this_00->field_2) {
        operator_delete(ppvVar2,(this_00->field_2)._M_allocated_capacity + 1);
      }
    }
    uVar4 = 0x20;
  }
LAB_001102dc:
  operator_delete(this_00,uVar4);
switchD_001101fd_default:
  return;
}

Assistant:

void ExtensionSet::Extension::Free() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                          \
      case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
        delete repeated_##LOWERCASE##_value;                       \
        break

      HANDLE_TYPE(  INT32,   int32);
      HANDLE_TYPE(  INT64,   int64);
      HANDLE_TYPE( UINT32,  uint32);
      HANDLE_TYPE( UINT64,  uint64);
      HANDLE_TYPE(  FLOAT,   float);
      HANDLE_TYPE( DOUBLE,  double);
      HANDLE_TYPE(   BOOL,    bool);
      HANDLE_TYPE(   ENUM,    enum);
      HANDLE_TYPE( STRING,  string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    switch (cpp_type(type)) {
      case WireFormatLite::CPPTYPE_STRING:
        delete string_value;
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_lazy) {
          delete lazymessage_value;
        } else {
          delete message_value;
        }
        break;
      default:
        break;
    }
  }
}